

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void kj::
     ctor<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
               (ExclusiveJoinPromiseNode *location,
               Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params,
               Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_1,SourceLocation *params_2)

{
  ExclusiveJoinPromiseNode *this;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  SourceLocation *pSVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_48;
  byte local_39;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  undefined1 local_2a;
  SourceLocation *local_28;
  SourceLocation *params_local_2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_local_1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_local;
  ExclusiveJoinPromiseNode *location_local;
  
  local_28 = params_2;
  params_local_2 = (SourceLocation *)params_1;
  params_local_1 = params;
  params_local = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)location;
  this = (ExclusiveJoinPromiseNode *)operator_new(0xb8);
  local_39 = 0;
  if (this != (ExclusiveJoinPromiseNode *)0x0) {
    local_2a = 1;
    pOVar1 = fwd<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(params_local_1);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own(&local_38,pOVar1);
    local_39 = 1;
    pOVar1 = fwd<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                       ((NoInfer<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)
                        params_local_2);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own(&local_48,pOVar1);
    pSVar2 = fwd<kj::SourceLocation&>(local_28);
    _::ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode(this,&local_38,&local_48,*pSVar2);
  }
  local_2a = 0;
  if (this != (ExclusiveJoinPromiseNode *)0x0) {
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_48);
  }
  if ((local_39 & 1) != 0) {
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_38);
  }
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}